

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SplayTree.h
# Opt level: O0

void __thiscall SplayTree<unsigned_long>::rotate(SplayTree<unsigned_long> *this,Node *A,Node *B)

{
  Node *this_00;
  Node *parent;
  Node *B_local;
  Node *A_local;
  SplayTree<unsigned_long> *this_local;
  
  this_00 = A->parent;
  if (A->left == B) {
    Node::setL(A,B->right);
    Node::setR(B,A);
  }
  else {
    Node::setR(A,B->left);
    Node::setL(B,A);
  }
  if (this_00 == (Node *)0x0) {
    this->root = B;
    B->parent = (Node *)0x0;
  }
  else if (this_00->left == A) {
    Node::setL(this_00,B);
  }
  else {
    Node::setR(this_00,B);
  }
  return;
}

Assistant:

void rotate(Node *A, Node *B) {
    Node *parent = A->parent;

    if (A->left == B) {
      A->setL(B->right);
      B->setR(A);
    } else {
      A->setR(B->left);
      B->setL(A);
    }

    if (!parent)
      root = B, B->parent = nullptr;
    else if (parent->left == A)
      parent->setL(B);
    else
      parent->setR(B);
  }